

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O1

Value * __thiscall ccd::Json::Value::operator=(Value *this,Value *other)

{
  anon_class_8_1_8991fb9c local_10;
  
  this->m_type = other->m_type;
  local_10.this =
       (_Copy_assign_base<false,_int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
        *)&this->m_value;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>_&>
    ::_S_vtable._M_arr
    [(long)(char)*(__index_type *)
                  ((long)&(other->m_value).
                          super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
                          .
                          super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                          .
                          super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                          .
                          super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                          .
                          super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                          .
                          super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                  + 0x30) + 1]._M_data)(&local_10,&other->m_value);
  return this;
}

Assistant:

Value& Value::operator = ( const Value& other )
{
	m_type = other.m_type;
	m_value = other.m_value;
	return *this;
}